

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

RealType __thiscall
OpenMD::EAM::Zhou2004Functional
          (EAM *this,RealType rho,RealType rhoe,RealType rhos,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType Fe,RealType eta,RealType rhol,RealType rhoh)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = rhol * rhoe;
  if (dVar6 <= rho) {
    if ((rho < dVar6) || (rhoh * rhoe <= rho)) {
      if (rho < rhoh * rhoe) {
        return 0.0;
      }
      dVar6 = pow(rho / rhos,eta);
      dVar6 = log(dVar6);
      dVar5 = pow(rho / rhos,eta);
      return dVar5 * (1.0 - dVar6) * Fe;
    }
    pdVar2 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (F->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pdVar1 - (long)pdVar2 >> 3;
    if (pdVar1 == pdVar2) goto LAB_0024e124;
    if (uVar3 < 2) goto LAB_0024e12f;
    if ((long)pdVar1 - (long)pdVar2 == 0x10) goto LAB_0024e13d;
    if (3 < uVar3) {
      dVar6 = rho / rhoe;
      goto LAB_0024e09a;
    }
  }
  else {
    pdVar2 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (Fn->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pdVar1 - (long)pdVar2 >> 3;
    if (pdVar1 == pdVar2) {
LAB_0024e124:
      uVar4 = 0;
      goto LAB_0024e157;
    }
    if (uVar3 < 2) {
LAB_0024e12f:
      uVar4 = 1;
      goto LAB_0024e157;
    }
    if ((long)pdVar1 - (long)pdVar2 == 0x10) {
LAB_0024e13d:
      uVar4 = 2;
      goto LAB_0024e157;
    }
    if (3 < uVar3) {
      dVar6 = rho / dVar6;
LAB_0024e09a:
      dVar6 = dVar6 + -1.0;
      return ((pdVar2[3] * dVar6 + pdVar2[2]) * dVar6 + pdVar2[1]) * dVar6 + *pdVar2;
    }
  }
  uVar4 = 3;
LAB_0024e157:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

RealType EAM::Zhou2004Functional(RealType rho, RealType rhoe, RealType rhos,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType Fe,
                                   RealType eta, RealType rhol, RealType rhoh) {
    RealType rhon = rhol * rhoe;
    RealType rho0 = rhoh * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rhon <= rho && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F.at(3)));
    } else if (rho0 <= rho) {
      t          = rho / rhos;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }